

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fn.hpp
# Opt level: O0

vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
* __thiscall
rangeless::fn::impl::
maybe<std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>_>
::operator*(maybe<std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>_>
            *this)

{
  maybe<std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>_>
  *this_local;
  
  if (((this->m_empty ^ 0xffU) & 1) == 0) {
    __assert_fail("!m_empty",
                  "/workspace/llm4binary/github/license_c_cmakelists/ast-al[P]rangeless/include/fn.hpp"
                  ,199,
                  "T &rangeless::fn::impl::maybe<std::vector<std::pair<std::basic_string<char>, unsigned long>>>::operator*() [T = std::vector<std::pair<std::basic_string<char>, unsigned long>>]"
                 );
  }
  return (vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
          *)this;
}

Assistant:

T& operator*() noexcept
        {
            assert(!m_empty);

#if __cplusplus >= 201703L
            return *std::launder(&m_value);
#else
            return m_value;
#endif
        }